

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  
  uVar8 = (long)end - (long)ptr;
  if ((long)uVar8 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar7 = 0;
  pbVar6 = (byte *)ptr;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_004dd912:
      iVar7 = 0;
      if (uVar8 < 4) {
        return -2;
      }
      goto switchD_004dda37_caseD_13;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (bVar2 < 0x16) {
        if (bVar2 == 6) {
          if (uVar8 == 2) {
            return -2;
          }
          goto switchD_004dda37_caseD_13;
        }
        if (bVar2 != 7) {
          if (bVar2 == 0x13) {
            pbVar6 = (byte *)(ptr + 2);
            if ((long)end - (long)pbVar6 < 2) {
              return -1;
            }
            if (ptr[3] == '\0') {
              if ((ulong)*pbVar6 == 0x78) {
                pbVar6 = (byte *)(ptr + 4);
                if ((long)end - (long)pbVar6 < 2) {
                  return -1;
                }
                if ((ptr[5] == '\0') &&
                   ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar6) & 0xfe) == 0x18)) {
                  pbVar6 = (byte *)(ptr + 6);
                  lVar5 = (long)end - (long)pbVar6;
                  while( true ) {
                    if (lVar5 < 2) {
                      return -1;
                    }
                    if (pbVar6[1] != 0) goto switchD_004dda37_caseD_13;
                    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar6);
                    if (1 < bVar1 - 0x18) break;
                    pbVar6 = pbVar6 + 2;
                    lVar5 = lVar5 + -2;
                  }
                  if (bVar1 == 0x12) {
                    iVar7 = 10;
                    pbVar6 = pbVar6 + 2;
                  }
                }
              }
              else if (*(char *)((long)enc[1].scanners + (ulong)*pbVar6) == '\x19') {
                lVar5 = uVar8 - 4;
                pbVar4 = (byte *)(ptr + 4);
                do {
                  pbVar6 = pbVar4;
                  if (lVar5 < 2) {
                    return -1;
                  }
                  if (pbVar6[1] != 0) goto switchD_004dda37_caseD_13;
                  cVar3 = *(char *)((long)enc[1].scanners + (ulong)*pbVar6);
                  lVar5 = lVar5 + -2;
                  pbVar4 = pbVar6 + 2;
                } while (cVar3 == '\x19');
                if (cVar3 == '\x12') {
                  iVar7 = 10;
                  pbVar6 = pbVar6 + 2;
                }
              }
            }
          }
          goto switchD_004dda37_caseD_13;
        }
        goto LAB_004dd912;
      }
      if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_004dd9df;
      if (bVar2 != 0x1d) goto switchD_004dda37_caseD_13;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr))))
  goto switchD_004dda37_caseD_13;
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)*ptr & 0x1f) & 1) != 0) {
LAB_004dd9df:
    pbVar6 = (byte *)(ptr + 2);
    uVar8 = (long)end - (long)pbVar6;
    while( true ) {
      if ((long)uVar8 < 2) {
        return -1;
      }
      bVar1 = pbVar6[1];
      if (bVar1 < 0xdc) break;
      if (bVar1 == 0xff) {
        if (0xfd < *pbVar6) goto switchD_004dda37_caseD_13;
      }
      else if (bVar1 - 0xdc < 4) goto switchD_004dda37_caseD_13;
switchD_004dda37_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(*pbVar6 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
           >> (*pbVar6 & 0x1f) & 1) == 0) goto switchD_004dda37_caseD_13;
switchD_004dda37_caseD_16:
      pbVar6 = pbVar6 + 2;
      uVar8 = uVar8 - 2;
    }
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) goto LAB_004ddb5f;
      goto switchD_004dda37_caseD_1d;
    }
    cVar3 = *(char *)((long)enc[1].scanners + (ulong)*pbVar6);
    switch(cVar3) {
    case '\x12':
      pbVar6 = pbVar6 + 2;
      iVar7 = 9;
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
    case '\x1c':
      break;
    case '\x16':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
      goto switchD_004dda37_caseD_16;
    case '\x1d':
      goto switchD_004dda37_caseD_1d;
    default:
      if (cVar3 == '\x06') {
        if (uVar8 == 2) {
          return -2;
        }
      }
      else if (cVar3 == '\a') {
LAB_004ddb5f:
        if (uVar8 < 4) {
          return -2;
        }
      }
    }
  }
switchD_004dda37_caseD_13:
  *nextTokPtr = (char *)pbVar6;
  return iVar7;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}